

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void * __thiscall jpgd::jpeg_decoder::alloc(jpeg_decoder *this,size_t nSize,bool zero)

{
  mem_block **ppmVar1;
  ulong uVar2;
  uint uVar3;
  mem_block *pmVar4;
  ulong __n;
  size_t sVar5;
  char *__s;
  
  __n = nSize + 3 + (ulong)(nSize == 0) & 0xfffffffffffffffc;
  ppmVar1 = &this->m_pMem_blocks;
  __s = (char *)0x0;
  pmVar4 = (mem_block *)ppmVar1;
  do {
    pmVar4 = pmVar4->m_pNext;
    if (pmVar4 == (mem_block *)0x0) goto LAB_001d7696;
    uVar2 = pmVar4->m_used_count + __n;
  } while (pmVar4->m_size < uVar2);
  __s = pmVar4->m_data + pmVar4->m_used_count;
  pmVar4->m_used_count = uVar2;
LAB_001d7696:
  if (__s == (char *)0x0) {
    uVar3 = (int)__n + 0x7ffU & 0xfffff800;
    sVar5 = 0x7f00;
    if (0x7f00 < (int)uVar3) {
      sVar5 = (size_t)uVar3;
    }
    pmVar4 = (mem_block *)malloc(sVar5 + 0x20);
    if (pmVar4 == (mem_block *)0x0) {
      stop_decoding(this,JPGD_NOTENOUGHMEM);
    }
    pmVar4->m_pNext = *ppmVar1;
    *ppmVar1 = pmVar4;
    pmVar4->m_used_count = __n;
    pmVar4->m_size = sVar5;
    __s = pmVar4->m_data;
  }
  if (zero) {
    memset(__s,0,__n);
  }
  return __s;
}

Assistant:

void* jpeg_decoder::alloc(size_t nSize, bool zero)
	{
		nSize = (JPGD_MAX(nSize, 1) + 3) & ~3;
		char* rv = nullptr;
		for (mem_block* b = m_pMem_blocks; b; b = b->m_pNext)
		{
			if ((b->m_used_count + nSize) <= b->m_size)
			{
				rv = b->m_data + b->m_used_count;
				b->m_used_count += nSize;
				break;
			}
		}
		if (!rv)
		{
			int capacity = JPGD_MAX(32768 - 256, ((int)nSize + 2047) & ~2047);
			mem_block* b = (mem_block*)jpgd_malloc(sizeof(mem_block) + capacity);
			if (!b)
			{
				stop_decoding(JPGD_NOTENOUGHMEM);
			}

			b->m_pNext = m_pMem_blocks;
			m_pMem_blocks = b;
			b->m_used_count = nSize;
			b->m_size = capacity;
			rv = b->m_data;
		}
		if (zero) memset(rv, 0, nSize);
		return rv;
	}